

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O0

void stbi__vertical_flip(void *image,int w,int h,int bytes_per_pixel)

{
  size_t local_858;
  size_t bytes_copy;
  size_t bytes_left;
  stbi_uc *row1;
  stbi_uc *row0;
  stbi_uc *bytes;
  stbi_uc temp [2048];
  size_t bytes_per_row;
  int row;
  int bytes_per_pixel_local;
  int h_local;
  int w_local;
  void *image_local;
  
  temp._2040_8_ = (long)w * (long)bytes_per_pixel;
  for (bytes_per_row._0_4_ = 0; (int)bytes_per_row < h >> 1;
      bytes_per_row._0_4_ = (int)bytes_per_row + 1) {
    row1 = (stbi_uc *)((long)image + (long)(int)bytes_per_row * temp._2040_8_);
    bytes_left = (long)image + (long)((h - (int)bytes_per_row) + -1) * temp._2040_8_;
    bytes_copy._0_1_ = temp[0x7f8];
    bytes_copy._1_1_ = temp[0x7f9];
    bytes_copy._2_1_ = temp[0x7fa];
    bytes_copy._3_1_ = temp[0x7fb];
    bytes_copy._4_1_ = temp[0x7fc];
    bytes_copy._5_1_ = temp[0x7fd];
    bytes_copy._6_1_ = temp[0x7fe];
    bytes_copy._7_1_ = temp[0x7ff];
    for (; bytes_copy != 0; bytes_copy = bytes_copy - local_858) {
      if (bytes_copy < 0x800) {
        local_858 = bytes_copy;
      }
      else {
        local_858 = 0x800;
      }
      memcpy(&bytes,row1,local_858);
      memcpy(row1,(void *)bytes_left,local_858);
      memcpy((void *)bytes_left,&bytes,local_858);
      row1 = row1 + local_858;
      bytes_left = local_858 + bytes_left;
    }
  }
  return;
}

Assistant:

static void stbi__vertical_flip(void *image, int w, int h, int bytes_per_pixel)
{
   int row;
   size_t bytes_per_row = (size_t)w * bytes_per_pixel;
   stbi_uc temp[2048];
   stbi_uc *bytes = (stbi_uc *)image;

   for (row = 0; row < (h>>1); row++) {
      stbi_uc *row0 = bytes + row*bytes_per_row;
      stbi_uc *row1 = bytes + (h - row - 1)*bytes_per_row;
      // swap row0 with row1
      size_t bytes_left = bytes_per_row;
      while (bytes_left) {
         size_t bytes_copy = (bytes_left < sizeof(temp)) ? bytes_left : sizeof(temp);
         memcpy(temp, row0, bytes_copy);
         memcpy(row0, row1, bytes_copy);
         memcpy(row1, temp, bytes_copy);
         row0 += bytes_copy;
         row1 += bytes_copy;
         bytes_left -= bytes_copy;
      }
   }
}